

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O1

int check_vector(N_Vector x,N_Vector y,sunrealtype tol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  
  lVar4 = N_VGetArrayPointer();
  lVar5 = N_VGetArrayPointer(y);
  lVar6 = N_VGetLength(x);
  lVar7 = N_VGetLength(y);
  if (lVar6 == lVar7) {
    uVar8 = 0;
    if (0 < lVar6) {
      lVar7 = 0;
      do {
        iVar3 = SUNRCompareTol(*(undefined8 *)(lVar4 + lVar7 * 8),*(undefined8 *)(lVar5 + lVar7 * 8)
                               ,tol);
        uVar8 = uVar8 + iVar3;
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
      uVar8 = (uint)(0 < (int)uVar8);
    }
    if (((char)uVar8 != '\0') && (puts("Check_vector failures:"), 0 < lVar6)) {
      lVar7 = 0;
      do {
        iVar3 = SUNRCompareTol(*(undefined8 *)(lVar4 + lVar7 * 8),*(undefined8 *)(lVar5 + lVar7 * 8)
                               ,tol);
        if (iVar3 != 0) {
          dVar1 = *(double *)(lVar4 + lVar7 * 8);
          dVar2 = *(double *)(lVar5 + lVar7 * 8);
          printf("  xdata[%ld] = %g != %g (err = %g)\n",dVar1,dVar2,ABS(dVar1 - dVar2),lVar7);
        }
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
  }
  else {
    puts(">>> ERROR: check_vector: Different data array lengths ");
    uVar8 = 1;
  }
  return uVar8;
}

Assistant:

int check_vector(N_Vector x, N_Vector y, sunrealtype tol)
{
  int failure = 0;
  sunrealtype *xdata, *ydata;
  sunindextype xldata, yldata;
  sunindextype i;

  /* get vector data */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);

  /* check data lengths */
  xldata = N_VGetLength(x);
  yldata = N_VGetLength(y);

  if (xldata != yldata)
  {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    return (1);
  }

  /* check vector data */
  for (i = 0; i < xldata; i++)
  {
    failure += SUNRCompareTol(xdata[i], ydata[i], tol);
  }

  if (failure > ZERO)
  {
    printf("Check_vector failures:\n");
    for (i = 0; i < xldata; i++)
    {
      if (SUNRCompareTol(xdata[i], ydata[i], tol) != 0)
      {
        printf("  xdata[%ld] = %" GSYM " != %" GSYM " (err = %" GSYM ")\n",
               (long int)i, xdata[i], ydata[i], SUNRabs(xdata[i] - ydata[i]));
      }
    }
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}